

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

void __thiscall
duckdb::DuckIndexScanState::TableScanFunc
          (DuckIndexScanState *this,ClientContext *context,TableFunctionInput *data_p,
          DataChunk *output)

{
  DataChunk *pDVar1;
  mutex *__mutex;
  _func_int **pp_Var2;
  LocalTableFunctionState *pLVar3;
  pointer plVar4;
  pointer plVar5;
  int iVar6;
  DuckTransaction *transaction;
  DataTable *this_00;
  LocalStorage *this_01;
  idx_t fetch_count;
  long lVar7;
  bool bVar8;
  Vector local_vector;
  LogicalType local_b0;
  Vector local_98;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pp_Var2 = (data_p->bind_data).ptr[4]._vptr_FunctionData;
  transaction = DuckTransaction::Get(context,(Catalog *)pp_Var2[0x1b]);
  this_00 = (DataTable *)(**(code **)(*pp_Var2 + 0x80))(pp_Var2);
  optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid(&data_p->local_state);
  pLVar3 = (data_p->local_state).ptr;
  plVar4 = (this->row_ids).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  plVar5 = (this->row_ids).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  __mutex = &this->index_scan_lock;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 == 0) {
    if (this->finished == true) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      lVar7 = (long)plVar4 - (long)plVar5 >> 3;
      pLVar3[1]._vptr_LocalTableFunctionState =
           (_func_int **)(this->next_batch_index).super___atomic_base<unsigned_long>._M_i;
      LOCK();
      (this->next_batch_index).super___atomic_base<unsigned_long>._M_i =
           (this->next_batch_index).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      pp_Var2 = pLVar3[1]._vptr_LocalTableFunctionState;
      fetch_count = lVar7 + (long)pp_Var2 * -0x800;
      bVar8 = fetch_count < 0x800;
      if (!bVar8) {
        fetch_count = 0x800;
      }
      this->finished = bVar8;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (lVar7 != (long)pp_Var2 * 0x800) {
        plVar4 = (this->row_ids).super_vector<long,_std::allocator<long>_>.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        LogicalType::LogicalType(&local_b0,BIGINT);
        Vector::Vector(&local_98,&local_b0,(data_ptr_t)(plVar4 + (long)pp_Var2 * 0x800));
        LogicalType::~LogicalType(&local_b0);
        if ((this->super_TableScanGlobalState).projection_ids.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->super_TableScanGlobalState).projection_ids.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          DataTable::Fetch(this_00,transaction,output,&this->column_ids,&local_98,fetch_count,
                           (ColumnFetchState *)(pLVar3 + 10));
        }
        else {
          pDVar1 = (DataChunk *)(pLVar3 + 2);
          DataChunk::Reset(pDVar1);
          DataTable::Fetch(this_00,transaction,pDVar1,&this->column_ids,&local_98,fetch_count,
                           (ColumnFetchState *)(pLVar3 + 10));
          DataChunk::ReferenceColumns
                    (output,pDVar1,&(this->super_TableScanGlobalState).projection_ids);
        }
        if (local_98.auxiliary.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.auxiliary.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.buffer.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.buffer.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        LogicalType::~LogicalType(&local_98.type);
      }
    }
    if (output->count == 0) {
      this_01 = LocalStorage::Get(transaction);
      if ((this->super_TableScanGlobalState).projection_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->super_TableScanGlobalState).projection_ids.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        LocalStorage::Scan(this_01,(CollectionScanState *)(pLVar3 + 0x25),&this->column_ids,output);
      }
      else {
        pDVar1 = (DataChunk *)(pLVar3 + 2);
        DataChunk::Reset(pDVar1);
        LocalStorage::Scan(this_01,(CollectionScanState *)(pLVar3 + 0x25),&this->column_ids,pDVar1);
        DataChunk::ReferenceColumns
                  (output,pDVar1,&(this->super_TableScanGlobalState).projection_ids);
      }
    }
    return;
  }
  ::std::__throw_system_error(iVar6);
}

Assistant:

void TableScanFunc(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) override {
		auto &bind_data = data_p.bind_data->Cast<TableScanBindData>();
		auto &duck_table = bind_data.table.Cast<DuckTableEntry>();
		auto &tx = DuckTransaction::Get(context, duck_table.catalog);
		auto &storage = duck_table.GetStorage();
		auto &l_state = data_p.local_state->Cast<IndexScanLocalState>();

		auto row_id_count = row_ids.size();
		idx_t scan_count = 0;
		idx_t offset = 0;

		{
			// Synchronize changes to the shared global state.
			lock_guard<mutex> l(index_scan_lock);
			if (!finished) {
				l_state.batch_index = next_batch_index;
				next_batch_index++;

				offset = l_state.batch_index * STANDARD_VECTOR_SIZE;
				auto remaining = row_id_count - offset;
				scan_count = remaining < STANDARD_VECTOR_SIZE ? remaining : STANDARD_VECTOR_SIZE;
				finished = remaining < STANDARD_VECTOR_SIZE ? true : false;
			}
		}

		if (scan_count != 0) {
			auto row_id_data = (data_ptr_t)&row_ids[0 + offset]; // NOLINT - this is not pretty
			Vector local_vector(LogicalType::ROW_TYPE, row_id_data);

			if (CanRemoveFilterColumns()) {
				l_state.all_columns.Reset();
				storage.Fetch(tx, l_state.all_columns, column_ids, local_vector, scan_count, l_state.fetch_state);
				output.ReferenceColumns(l_state.all_columns, projection_ids);
			} else {
				storage.Fetch(tx, output, column_ids, local_vector, scan_count, l_state.fetch_state);
			}
		}

		if (output.size() == 0) {
			auto &local_storage = LocalStorage::Get(tx);
			if (CanRemoveFilterColumns()) {
				l_state.all_columns.Reset();
				local_storage.Scan(l_state.scan_state.local_state, column_ids, l_state.all_columns);
				output.ReferenceColumns(l_state.all_columns, projection_ids);
			} else {
				local_storage.Scan(l_state.scan_state.local_state, column_ids, output);
			}
		}
	}